

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O0

void n_number_suite::run(void)

{
  n_multidigit_number_then_nil();
  n_number_plus_plus();
  n_number_plus_1();
  n_number_plus_inf();
  n_number_minus_01();
  n_number_minus_1_dot_0_dot();
  n_number_minus_2_dot();
  n_number_minus_nan();
  n_number_dot_minus_1();
  n_number_dot_2_exp_minus_3();
  n_number_0_dot_1_dot_2();
  n_number_0_dot_3_exp_plus();
  n_number_0_dot_3_exp();
  n_number_0_dot_exp_1();
  n_number_0_capital_exp_plus();
  n_number_0_capital_exp();
  n_number_0_exp_plus();
  n_number_0_exp();
  n_number_1_dot_0_exp_plus();
  n_number_1_dot_0_exp_minus();
  n_number_1_dot_0_exp();
  n_number_1_000_dot_0();
  n_number_1_exp_capital_exp_2();
  n_number_2_dot_exp_plus_3();
  n_number_2_dot_exp_minus_3();
  n_number_2_dot_exp_3();
  n_number_9_dot_exp_plus();
  n_number_inf();
  n_number_nan();
  n_number_u_FF11_fullwidth_digit_one();
  n_number_expression();
  n_number_hex_1_digit();
  n_number_hex_2_digits();
  n_number_infinity();
  n_number_invalid_plus_minus();
  n_number_invalid_negative_real();
  n_number_invalid_utf_8_in_bigger_int();
  n_number_invalid_utf_8_in_exponent();
  n_number_invalid_utf_8_in_int();
  n_number_minus_infinity();
  n_number_minus_sign_with_trailing_garbage();
  n_number_minus_space_1();
  n_number_neg_int_starting_with_zero();
  n_number_neg_real_without_int_part();
  n_number_neg_with_garbage_at_end();
  n_number_real_garbage_after_exp();
  n_number_real_with_invalid_utf8_after_exp();
  n_number_real_without_fractional_part();
  n_number_starting_with_dot();
  n_number_with_alpha();
  n_number_with_alpha_char();
  n_number_with_leading_zero();
  return;
}

Assistant:

void run()
{
    n_multidigit_number_then_nil();

    n_number_plus_plus();
    n_number_plus_1();
    n_number_plus_inf();
    n_number_minus_01();
    n_number_minus_1_dot_0_dot();
    n_number_minus_2_dot();
    n_number_minus_nan();
    n_number_dot_minus_1();
    n_number_dot_2_exp_minus_3();
    n_number_0_dot_1_dot_2();
    n_number_0_dot_3_exp_plus();
    n_number_0_dot_3_exp();
    n_number_0_dot_exp_1();
    n_number_0_capital_exp_plus();
    n_number_0_capital_exp();
    n_number_0_exp_plus();
    n_number_0_exp();
    n_number_1_dot_0_exp_plus();
    n_number_1_dot_0_exp_minus();
    n_number_1_dot_0_exp();
    n_number_1_000_dot_0();
    n_number_1_exp_capital_exp_2();
    n_number_2_dot_exp_plus_3();
    n_number_2_dot_exp_minus_3();
    n_number_2_dot_exp_3();
    n_number_9_dot_exp_plus();
    n_number_inf();
    n_number_nan();
    n_number_u_FF11_fullwidth_digit_one();
    n_number_expression();
    n_number_hex_1_digit();
    n_number_hex_2_digits();
    n_number_infinity();
    n_number_invalid_plus_minus();
    n_number_invalid_negative_real();
    n_number_invalid_utf_8_in_bigger_int();
    n_number_invalid_utf_8_in_exponent();
    n_number_invalid_utf_8_in_int();
    n_number_minus_infinity();
    n_number_minus_sign_with_trailing_garbage();
    n_number_minus_space_1();
    n_number_neg_int_starting_with_zero();
    n_number_neg_real_without_int_part();
    n_number_neg_with_garbage_at_end();
    n_number_real_garbage_after_exp();
    n_number_real_with_invalid_utf8_after_exp();
    n_number_real_without_fractional_part();
    n_number_starting_with_dot();
    n_number_with_alpha();
    n_number_with_alpha_char();
    n_number_with_leading_zero();
}